

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
CGL::GLScene::Scene::set_draw_styles
          (Scene *this,DrawStyle *defaultStyle,DrawStyle *hoveredStyle,DrawStyle *selectedStyle)

{
  bool bVar1;
  reference ppSVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  SceneObject *obj;
  iterator __end2;
  iterator __begin2;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *__range2;
  vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
  *in_stack_ffffffffffffffb8;
  __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
  local_30 [2];
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_30[0]._M_current =
       (SceneObject **)
       std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::end
            (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppSVar2 = __gnu_cxx::
              __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
              ::operator*(local_30);
    in_stack_ffffffffffffffc0 =
         (__normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
          *)*ppSVar2;
    (*(code *)*in_stack_ffffffffffffffc0->_M_current)
              (in_stack_ffffffffffffffc0,local_10,local_18,local_20);
    __gnu_cxx::
    __normal_iterator<CGL::GLScene::SceneObject_**,_std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>_>
    ::operator++(local_30);
  }
  return;
}

Assistant:

void Scene::set_draw_styles(DrawStyle *defaultStyle, DrawStyle *hoveredStyle,
                             DrawStyle *selectedStyle) {
  for (SceneObject *obj : objects) {
    obj->set_draw_styles(defaultStyle, hoveredStyle, selectedStyle);
  }
}